

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O2

void __thiscall CMapLayers::CMapLayers(CMapLayers *this,int Type)

{
  int iVar1;
  undefined4 in_register_00000034;
  
  (this->super_CComponent)._vptr_CComponent = (_func_int **)&PTR__CMapLayers_00207388;
  iVar1 = Type;
  array<CEnvPoint,_allocator_default<CEnvPoint>_>::init
            (&this->m_lEnvPoints,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,Type));
  array<CEnvPoint,_allocator_default<CEnvPoint>_>::init
            (&this->m_lEnvPointsMenu,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,iVar1));
  this->m_Type = Type;
  this->m_OnlineStartTime = 0.0;
  this->m_pMenuLayers = (CLayers *)0x0;
  this->m_pMenuMap = (IEngineMap *)0x0;
  return;
}

Assistant:

CMapLayers::CMapLayers(int Type)
{
	m_Type = Type;
	m_pMenuMap = 0;
	m_pMenuLayers = 0;
	m_OnlineStartTime = 0;
}